

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void write_srec(char *file,char *ext,int base)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  FILE *fp;
  int j;
  int i;
  int pos;
  int cnt;
  int dump;
  int addr;
  char fname [128];
  byte local_1e;
  uchar chksum;
  uchar data;
  int base_local;
  char *ext_local;
  char *file_local;
  
  iVar2 = strcmp(ext,"mx");
  if (iVar2 == 0) {
    printf("writing mx file... ");
  }
  else {
    printf("writing s-record file... ");
  }
  fflush(_stdout);
  strcpy((char *)&dump,file);
  strcat((char *)&dump,".");
  strcat((char *)&dump,ext);
  __stream = fopen((char *)&dump,"w");
  if (__stream == (FILE *)0x0) {
    printf("can not open file \'%s\'!\n",&dump);
  }
  else {
    bVar1 = false;
    i = 0;
    j = 0;
    for (fp._4_4_ = 0; fp._4_4_ <= max_bank; fp._4_4_ = fp._4_4_ + 1) {
      for (fp._0_4_ = 0; (int)fp < 0x2000; fp._0_4_ = (int)fp + 1) {
        if (map[fp._4_4_][(int)fp] == 0xff) {
          if (i != 0) {
            bVar1 = true;
          }
        }
        else {
          if (i == 0) {
            j = (int)fp;
          }
          i = i + 1;
          if (i == 0x20) {
            bVar1 = true;
          }
        }
        if (((int)fp == 0x1fff) && (i != 0)) {
          bVar1 = true;
        }
        if (bVar1) {
          bVar1 = false;
          uVar3 = base + fp._4_4_ * 0x2000 + j;
          local_1e = (char)i + (char)(uVar3 >> 0x10) + (char)(uVar3 >> 8) + (char)uVar3 + 4;
          fprintf(__stream,"S2%02X%06X",(ulong)(i + 4),(ulong)uVar3);
          for (; i != 0; i = i + -1) {
            local_1e = local_1e + rom[fp._4_4_][j];
            fprintf(__stream,"%02X",(ulong)rom[fp._4_4_][j]);
            j = j + 1;
          }
          fprintf(__stream,"%02X\n",(ulong)((local_1e ^ 0xffffffff) & 0xff));
        }
      }
    }
    uVar3 = ((int)(uint)map[0][0] >> 5) << 0xd;
    fprintf(__stream,"S804%06X%02X",(ulong)uVar3,
            (ulong)(((byte)((char)(uVar3 >> 8) + 4) ^ 0xffffffff) & 0xff));
    fclose(__stream);
    printf("OK\n");
  }
  return;
}

Assistant:

void
write_srec(char *file, char *ext, int base)
{
	unsigned char data, chksum;
	char  fname[128];
	int   addr, dump, cnt, pos, i, j;
	FILE *fp;

	/* status message */
	if (!strcmp(ext, "mx"))
		printf("writing mx file... ");
	else
		printf("writing s-record file... ");

	/* flush output */
	fflush(stdout);

	/* add the file extension */
	strcpy(fname, file);
	strcat(fname, ".");
	strcat(fname, ext);

	/* open the file */
	if ((fp = fopen(fname, "w")) == NULL) {
		printf("can not open file '%s'!\n", fname);
		return;
	}

	/* dump the rom */
	dump = 0;
	cnt  = 0;
	pos  = 0;

	for (i = 0; i <= max_bank; i++) {
		for (j = 0; j < 8192; j++) {
			if (map[i][j] != 0xFF) {
				/* data byte */
				if (cnt == 0)
					pos = j;
				cnt++;
				if (cnt == 32)
					dump = 1;
			}
			else {
				/* free byte */
				if (cnt)
					dump = 1;
			}
			if (j == 8191)
				if (cnt)
					dump = 1;

			/* dump */
			if (dump) {
				dump = 0;
				addr = base + (i << 13) + pos;
				chksum = cnt + ((addr >> 16) & 0xFF) +
							   ((addr >> 8) & 0xFF) +
							   ((addr) & 0xFF) +
							   4;

				/* number, address */
				fprintf(fp, "S2%02X%06X", cnt + 4, addr);

				/* code */
				while (cnt) {
					data = rom[i][pos++];
					chksum += data;
					fprintf(fp, "%02X", data);
					cnt--;
				}

				/* chksum */
				fprintf(fp, "%02X\n", (~chksum) & 0xFF);
			}
		}
	}

	/* starting address */
	addr   = ((map[0][0] >> 5) << 13);
	chksum = ((addr >> 8) & 0xFF) + (addr & 0xFF) + 4;
	fprintf(fp, "S804%06X%02X", addr, (~chksum) & 0xFF);

	/* ok */
	fclose(fp);
	printf("OK\n");
}